

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkUtil.c
# Opt level: O0

int Nwk_ManGetTotalFanins(Nwk_Man_t *pNtk)

{
  int iVar1;
  Nwk_Obj_t *p;
  int local_20;
  int local_1c;
  int nFanins;
  int i;
  Nwk_Obj_t *pNode;
  Nwk_Man_t *pNtk_local;
  
  local_20 = 0;
  for (local_1c = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), local_1c < iVar1; local_1c = local_1c + 1) {
    p = (Nwk_Obj_t *)Vec_PtrEntry(pNtk->vObjs,local_1c);
    if ((p != (Nwk_Obj_t *)0x0) && (iVar1 = Nwk_ObjIsNode(p), iVar1 != 0)) {
      iVar1 = Nwk_ObjFaninNum(p);
      local_20 = iVar1 + local_20;
    }
  }
  return local_20;
}

Assistant:

int Nwk_ManGetTotalFanins( Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pNode;
    int i, nFanins = 0;
    Nwk_ManForEachNode( pNtk, pNode, i )
        nFanins += Nwk_ObjFaninNum(pNode);
    return nFanins;
}